

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_eda0b::DepsLogTestWriteRead::Run(DepsLogTestWriteRead *this)

{
  Node *pNVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  LoadStatus LVar5;
  Node *pNVar6;
  Deps *pDVar7;
  ulong uVar8;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  StringPiece path_03;
  StringPiece path_04;
  StringPiece path_05;
  StringPiece path_06;
  string err;
  DepsLog log1;
  DepsLog log2;
  State state2;
  State state1;
  string local_348;
  string local_328;
  DepsLog local_308;
  DepsLog local_2a8;
  undefined1 local_248 [272];
  State local_138;
  
  State::State(&local_138);
  pTVar2 = g_current_test;
  local_308.file_path_._M_dataplus._M_p = (pointer)&local_308.file_path_.field_2;
  local_308.needs_recompaction_ = false;
  local_308.file_ = (FILE *)0x0;
  local_308.file_path_._M_string_length = 0;
  local_308.file_path_.field_2._M_local_buf[0] = '\0';
  local_308.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"DepsLogTest-tempfile","");
  bVar3 = DepsLog::OpenForWrite(&local_308,(string *)local_248,&local_348);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
             ,0x2e,"log1.OpenForWrite(kTestFilename, &err)");
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  pTVar2 = g_current_test;
  iVar4 = std::__cxx11::string::compare((char *)&local_348);
  bVar3 = testing::Test::Check
                    (pTVar2,iVar4 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x2f,"\"\" == err");
  if (!bVar3) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_00160e07;
  }
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = 0;
  path.len_ = 5;
  path.str_ = "foo.h";
  local_2a8._0_8_ = State::GetNode(&local_138,path,0);
  std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
            ((vector<Node*,std::allocator<Node*>> *)local_248,(Node **)&local_2a8);
  path_00.len_ = 5;
  path_00.str_ = "bar.h";
  local_2a8._0_8_ = State::GetNode(&local_138,path_00,0);
  std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
            ((vector<Node*,std::allocator<Node*>> *)local_248,(Node **)&local_2a8);
  path_01.len_ = 5;
  path_01.str_ = "out.o";
  pNVar6 = State::GetNode(&local_138,path_01,0);
  DepsLog::RecordDeps(&local_308,pNVar6,1,(vector<Node_*,_std::allocator<Node_*>_> *)local_248);
  if (local_248._8_8_ != local_248._0_8_) {
    local_248._8_8_ = local_248._0_8_;
  }
  path_02.len_ = 5;
  path_02.str_ = "foo.h";
  local_2a8._0_8_ = State::GetNode(&local_138,path_02,0);
  std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
            ((vector<Node*,std::allocator<Node*>> *)local_248,(Node **)&local_2a8);
  path_03.len_ = 6;
  path_03.str_ = "bar2.h";
  local_2a8._0_8_ = State::GetNode(&local_138,path_03,0);
  std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
            ((vector<Node*,std::allocator<Node*>> *)local_248,(Node **)&local_2a8);
  path_04.len_ = 6;
  path_04.str_ = "out2.o";
  pNVar6 = State::GetNode(&local_138,path_04,0);
  DepsLog::RecordDeps(&local_308,pNVar6,2,(vector<Node_*,_std::allocator<Node_*>_> *)local_248);
  path_05.len_ = 5;
  path_05.str_ = "out.o";
  pNVar6 = State::GetNode(&local_138,path_05,0);
  pDVar7 = DepsLog::GetDeps(&local_308,pNVar6);
  bVar3 = testing::Test::Check
                    (g_current_test,pDVar7 != (Deps *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x3d,"log_deps");
  if (((bVar3) &&
      (bVar3 = testing::Test::Check
                         (g_current_test,pDVar7->mtime == 1,
                          "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                          ,0x3e,"1 == log_deps->mtime"), bVar3)) &&
     (bVar3 = testing::Test::Check
                        (g_current_test,pDVar7->node_count == 2,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x3f,"2 == log_deps->node_count"), pTVar2 = g_current_test, bVar3)) {
    iVar4 = std::__cxx11::string::compare((char *)*pDVar7->nodes);
    bVar3 = testing::Test::Check
                      (pTVar2,iVar4 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x40,"\"foo.h\" == log_deps->nodes[0]->path()");
    pTVar2 = g_current_test;
    if (bVar3) {
      iVar4 = std::__cxx11::string::compare((char *)pDVar7->nodes[1]);
      bVar3 = testing::Test::Check
                        (pTVar2,iVar4 == 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x41,"\"bar.h\" == log_deps->nodes[1]->path()");
      if (bVar3) {
        if ((pointer)local_248._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
        }
        DepsLog::Close(&local_308);
        State::State((State *)local_248);
        pTVar2 = g_current_test;
        local_2a8.file_path_._M_dataplus._M_p = (pointer)&local_2a8.file_path_.field_2;
        local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffffffffff00;
        local_2a8.file_ = (FILE *)0x0;
        local_2a8.file_path_._M_string_length = 0;
        local_2a8.file_path_.field_2._M_local_buf[0] = '\0';
        local_2a8.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_328,"DepsLogTest-tempfile","");
        LVar5 = DepsLog::Load(&local_2a8,&local_328,(State *)local_248,&local_348);
        testing::Test::Check
                  (pTVar2,LVar5 != LOAD_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                   ,0x48,"log2.Load(kTestFilename, &state2, &err)");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        pTVar2 = g_current_test;
        iVar4 = std::__cxx11::string::compare((char *)&local_348);
        bVar3 = testing::Test::Check
                          (pTVar2,iVar4 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                           ,0x49,"\"\" == err");
        if ((bVar3) &&
           (bVar3 = testing::Test::Check
                              (g_current_test,
                               (long)local_308.nodes_.
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)local_308.nodes_.
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_start ==
                               (long)local_2a8.nodes_.
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)local_2a8.nodes_.
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_start,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                               ,0x4b,"log1.nodes().size() == log2.nodes().size()"), bVar3)) {
          if (0 < (int)((ulong)((long)local_308.nodes_.
                                      super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)local_308.nodes_.
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 3)) {
            uVar8 = 0;
            do {
              pNVar6 = local_308.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8];
              pNVar1 = local_2a8.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8];
              bVar3 = testing::Test::Check
                                (g_current_test,uVar8 == (uint)pNVar6->id_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                 ,0x4f,"i == node1->id()");
              if ((!bVar3) ||
                 (bVar3 = testing::Test::Check
                                    (g_current_test,pNVar6->id_ == pNVar1->id_,
                                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                     ,0x50,"node1->id() == node2->id()"), !bVar3))
              goto LAB_00160dba;
              uVar8 = uVar8 + 1;
            } while ((long)uVar8 <
                     (long)(int)((ulong)((long)local_308.nodes_.
                                               super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_308.nodes_.
                                              super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3));
          }
          path_06.len_ = 6;
          path_06.str_ = "out2.o";
          pNVar6 = State::GetNode((State *)local_248,path_06,0);
          pDVar7 = DepsLog::GetDeps(&local_2a8,pNVar6);
          bVar3 = testing::Test::Check
                            (g_current_test,pDVar7 != (Deps *)0x0,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                             ,0x55,"log_deps");
          if (((!bVar3) ||
              (bVar3 = testing::Test::Check
                                 (g_current_test,pDVar7->mtime == 2,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                  ,0x56,"2 == log_deps->mtime"), !bVar3)) ||
             (bVar3 = testing::Test::Check
                                (g_current_test,pDVar7->node_count == 2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                 ,0x57,"2 == log_deps->node_count"), pTVar2 = g_current_test, !bVar3
             )) goto LAB_00160dba;
          iVar4 = std::__cxx11::string::compare((char *)*pDVar7->nodes);
          bVar3 = testing::Test::Check
                            (pTVar2,iVar4 == 0,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                             ,0x58,"\"foo.h\" == log_deps->nodes[0]->path()");
          pTVar2 = g_current_test;
          if (!bVar3) goto LAB_00160dba;
          iVar4 = std::__cxx11::string::compare((char *)pDVar7->nodes[1]);
          bVar3 = testing::Test::Check
                            (pTVar2,iVar4 == 0,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                             ,0x59,"\"bar2.h\" == log_deps->nodes[1]->path()");
          if (!bVar3) goto LAB_00160dba;
        }
        else {
LAB_00160dba:
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
        DepsLog::~DepsLog(&local_2a8);
        State::~State((State *)local_248);
        goto LAB_00160e07;
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
LAB_00160e07:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,
                    CONCAT71(local_348.field_2._M_allocated_capacity._1_7_,
                             local_348.field_2._M_local_buf[0]) + 1);
  }
  DepsLog::~DepsLog(&local_308);
  if (local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_138.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001fda68;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_138.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_138.bindings_.bindings_._M_t);
  if (local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_138.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_138);
  return;
}

Assistant:

TEST_F(DepsLogTest, WriteRead) {
  State state1;
  DepsLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, &err));
  ASSERT_EQ("", err);

  {
    vector<Node*> deps;
    deps.push_back(state1.GetNode("foo.h", 0));
    deps.push_back(state1.GetNode("bar.h", 0));
    log1.RecordDeps(state1.GetNode("out.o", 0), 1, deps);

    deps.clear();
    deps.push_back(state1.GetNode("foo.h", 0));
    deps.push_back(state1.GetNode("bar2.h", 0));
    log1.RecordDeps(state1.GetNode("out2.o", 0), 2, deps);

    DepsLog::Deps* log_deps = log1.GetDeps(state1.GetNode("out.o", 0));
    ASSERT_TRUE(log_deps);
    ASSERT_EQ(1, log_deps->mtime);
    ASSERT_EQ(2, log_deps->node_count);
    ASSERT_EQ("foo.h", log_deps->nodes[0]->path());
    ASSERT_EQ("bar.h", log_deps->nodes[1]->path());
  }

  log1.Close();

  State state2;
  DepsLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &state2, &err));
  ASSERT_EQ("", err);

  ASSERT_EQ(log1.nodes().size(), log2.nodes().size());
  for (int i = 0; i < (int)log1.nodes().size(); ++i) {
    Node* node1 = log1.nodes()[i];
    Node* node2 = log2.nodes()[i];
    ASSERT_EQ(i, node1->id());
    ASSERT_EQ(node1->id(), node2->id());
  }

  // Spot-check the entries in log2.
  DepsLog::Deps* log_deps = log2.GetDeps(state2.GetNode("out2.o", 0));
  ASSERT_TRUE(log_deps);
  ASSERT_EQ(2, log_deps->mtime);
  ASSERT_EQ(2, log_deps->node_count);
  ASSERT_EQ("foo.h", log_deps->nodes[0]->path());
  ASSERT_EQ("bar2.h", log_deps->nodes[1]->path());
}